

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCCollisionTree.cpp
# Opt level: O1

void __thiscall
chrono::collision::ChCollisionTree::GetBoundingBox
          (ChCollisionTree *this,ChVector<double> *cmin,ChVector<double> *cmax,
          ChMatrix33<double> *rot)

{
  pointer ppCVar1;
  
  cmin->m_data[0] = 1.79769313486232e+308;
  cmin->m_data[1] = 1.79769313486232e+308;
  cmin->m_data[2] = 1.79769313486232e+308;
  cmax->m_data[0] = -1.79769313486232e+308;
  cmax->m_data[1] = -1.79769313486232e+308;
  cmax->m_data[2] = -1.79769313486232e+308;
  ppCVar1 = (this->geometries).
            super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar1 !=
      (this->geometries).
      super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (*ppCVar1 != (ChGeometry *)0x0) {
        geometry::ChGeometry::InflateBoundingBox(*ppCVar1,cmin,cmax,rot);
      }
      ppCVar1 = ppCVar1 + 1;
    } while (ppCVar1 !=
             (this->geometries).
             super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void ChCollisionTree::GetBoundingBox(ChVector<>& cmin, ChVector<>& cmax, const ChMatrix33<>& rot) {
    cmin = ChVector<>(+std::numeric_limits<double>::max());
    cmax = ChVector<>(-std::numeric_limits<double>::max());

    std::vector<geometry::ChGeometry*>::iterator nit = geometries.begin();
    for (; nit != geometries.end(); ++nit) {
        if ((*nit)) {
            (*nit)->InflateBoundingBox(cmin, cmax, rot);
        }
    }
}